

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# X86Disassembler.c
# Opt level: O1

_Bool translateOperand(MCInst *mcInst,OperandSpecifier *operand,InternalInstruction *insn)

{
  uint8_t uVar1;
  _Bool _Var2;
  byte bVar3;
  uint uVar4;
  ulong uVar5;
  ulong uVar6;
  uint8_t *puVar7;
  uint uVar8;
  bool bVar9;
  
LAB_0022aaa2:
  uVar1 = operand->encoding;
  switch(uVar1) {
  case '\x01':
    uVar5 = (ulong)insn->reg;
LAB_0022ab51:
    puVar7 = &translateRegister_llvmRegnums;
    break;
  case '\x02':
  case '\x03':
  case '\x04':
  case '\x05':
  case '\x06':
  case '\a':
  case '\b':
    _Var2 = translateRM(mcInst,operand,insn);
    return _Var2;
  case '\t':
    uVar5 = (ulong)insn->vvvv;
    goto LAB_0022ab51;
  case '\n':
    bVar9 = (insn->writemask & (MODRM_REG_DR6|MODRM_REG_RSP)) != MODRM_REG_AL;
    if (!bVar9) {
      MCOperand_CreateReg0(mcInst,insn->writemask + MODRM_REG_XMM14 & 0x7f);
      return bVar9;
    }
    return bVar9;
  default:
    return true;
  case '\x11':
  case '\x12':
  case '\x13':
  case '\x14':
  case '\x1a':
  case '\x1b':
    bVar3 = insn->numImmediatesTranslated;
    insn->numImmediatesTranslated = bVar3 + 1;
    uVar5 = insn->immediates[bVar3];
    bVar3 = operand->type;
    switch(bVar3) {
    case 0xc:
    case 0xd:
    case 0xe:
    case 0xf:
switchD_0022ab1c_caseD_c:
      if (uVar1 == '\x13') goto LAB_0022ac59;
      if (uVar1 == '\x12') {
LAB_0022ac4a:
        uVar6 = uVar5 | 0xffffffffffff0000;
        bVar9 = (short)uVar5 < 0;
      }
      else {
        if (uVar1 != '\x11') break;
LAB_0022ab39:
        uVar6 = uVar5 | 0xffffffffffffff00;
        bVar9 = (char)uVar5 < '\0';
      }
      goto LAB_0022ac69;
    case 0x10:
      if (uVar5 < 8) break;
      uVar4 = MCInst_getOpcode(mcInst);
      uVar8 = 0;
      bVar9 = true;
      switch(uVar4) {
      case 0x19f5:
        uVar8 = 0x19f6;
        break;
      case 0x19f6:
      case 0x19f8:
      case 0x19fa:
      case 0x19fc:
      case 0x19fe:
      case 0x1a00:
      case 0x1a02:
      case 0x1a04:
      case 0x1a06:
      case 0x1a08:
      case 0x1a0a:
        goto switchD_0022ad38_caseD_cc6;
      case 0x19f7:
        uVar8 = 0x19f8;
        break;
      case 0x19f9:
        uVar8 = 0x19fa;
        break;
      case 0x19fb:
        uVar8 = 0x19fc;
        break;
      case 0x19fd:
        uVar8 = 0x19fe;
        break;
      case 0x19ff:
        uVar8 = 0x1a00;
        break;
      case 0x1a01:
        uVar8 = 0x1a02;
        break;
      case 0x1a03:
        uVar8 = 0x1a04;
        break;
      case 0x1a05:
        uVar8 = 0x1a06;
        break;
      case 0x1a07:
        uVar8 = 0x1a08;
        break;
      case 0x1a09:
        uVar8 = 0x1a0a;
        break;
      case 0x1a0b:
        uVar8 = 0x1a0c;
        break;
      default:
        switch(uVar4) {
        case 0x230:
          uVar8 = 0x231;
          break;
        case 0x231:
        case 0x233:
        case 0x235:
        case 0x237:
        case 0x238:
        case 0x23a:
        case 0x23c:
        case 0x23d:
        case 0x23e:
        case 0x240:
          goto switchD_0022ad38_caseD_cc6;
        case 0x232:
          uVar8 = 0x233;
          break;
        case 0x234:
          uVar8 = 0x235;
          break;
        case 0x236:
          uVar8 = 0x237;
          break;
        case 0x239:
          uVar8 = 0x23a;
          break;
        case 0x23b:
          uVar8 = 0x23c;
          break;
        case 0x23f:
          uVar8 = 0x240;
          break;
        case 0x241:
          uVar8 = 0x242;
          break;
        default:
          switch(uVar4) {
          case 0x19db:
            uVar8 = 0x19dc;
            break;
          default:
            goto switchD_0022ad38_caseD_cc6;
          case 0x19dd:
            uVar8 = 0x19de;
            break;
          case 0x19df:
            uVar8 = 0x19e0;
            break;
          case 0x19e1:
            uVar8 = 0x19e2;
          }
        }
      }
LAB_0022afc5:
      bVar9 = false;
switchD_0022ad38_caseD_cc6:
      if (!bVar9) goto LAB_0022afcf;
      break;
    case 0x11:
      if (0x1f < uVar5) {
        uVar4 = MCInst_getOpcode(mcInst);
        uVar8 = 0;
        bVar9 = true;
        switch(uVar4) {
        case 0xcc5:
          uVar8 = 0xcc6;
          break;
        default:
          goto switchD_0022ad38_caseD_cc6;
        case 0xcc7:
          uVar8 = 0xcc8;
          break;
        case 0xcc9:
          uVar8 = 0xcca;
          break;
        case 0xccb:
          uVar8 = 0xccc;
          break;
        case 0xccd:
          uVar8 = 0xcce;
          break;
        case 0xccf:
          uVar8 = 0xcd0;
          break;
        case 0xcd1:
          uVar8 = 0xcd2;
          break;
        case 0xcd3:
          uVar8 = 0xcd4;
          break;
        case 0xcd5:
          uVar8 = 0xcd6;
          break;
        case 0xcd7:
          uVar8 = 0xcd8;
          break;
        case 0xcd9:
          uVar8 = 0xcda;
          break;
        case 0xcdb:
          uVar8 = 0xcdc;
          break;
        case 0xcdd:
          uVar8 = 0xcde;
          break;
        case 0xcdf:
          uVar8 = 0xce0;
          break;
        case 0xce1:
          uVar8 = 0xce2;
          break;
        case 0xce3:
          uVar8 = 0xce4;
          break;
        case 0xce5:
          uVar8 = 0xce6;
          break;
        case 0xce7:
          uVar8 = 0xce8;
          break;
        case 0xce9:
          uVar8 = 0xcea;
          break;
        case 0xceb:
          uVar8 = 0xcec;
          break;
        case 0xced:
          uVar8 = 0xcee;
          break;
        case 0xcef:
          uVar8 = 0xcf0;
        }
        goto LAB_0022afc5;
      }
      break;
    case 0x12:
      if (uVar5 < 8 && (~(uint)uVar5 & 3) != 0) break;
      uVar8 = MCInst_getOpcode(mcInst);
      uVar4 = (uVar8 - 0x1843 >> 1 | (uint)((uVar8 - 0x1843 & 1) != 0) << 0x1f) - 1;
      uVar8 = 0x1844;
      if (uVar4 < 0xcb) {
        uVar8 = *(uint *)(&DAT_003e37c8 + (ulong)uVar4 * 4);
      }
LAB_0022afcf:
      MCInst_setOpcode(mcInst,uVar8);
      break;
    default:
      if (bVar3 == 0x48) goto switchD_0022ab1c_caseD_c;
      if (bVar3 != 0x49) break;
      uVar1 = insn->displacementSize;
      if (uVar1 != '\x04') {
        if (uVar1 != '\x02') {
          if (uVar1 != '\x01') break;
          goto LAB_0022ab39;
        }
        goto LAB_0022ac4a;
      }
LAB_0022ac59:
      uVar6 = uVar5 | 0xffffffff00000000;
      bVar9 = (int)(uint)uVar5 < 0;
LAB_0022ac69:
      if (bVar9) {
        uVar5 = uVar6;
      }
    }
    uVar8 = (uint)uVar5;
    if (bVar3 < 0x36) {
      if (bVar3 - 3 < 2) {
        uVar6 = uVar5 | 0xffffffff00000000;
        bVar9 = (int)uVar8 < 0;
      }
      else {
        if (bVar3 != 1) goto LAB_0022acd2;
        uVar6 = uVar5 | 0xffffffffffffff00;
        bVar9 = (char)uVar5 < '\0';
      }
      if (bVar9) {
        uVar5 = uVar6;
      }
    }
    else {
      if (bVar3 - 0x36 < 3) {
        uVar8 = ((uint)(uVar5 >> 4) & 0xfffffff) + 0x7a;
        goto LAB_0022adf0;
      }
      if (bVar3 == 0x39) {
        uVar8 = (uVar8 >> 4) + 0x9a;
        goto LAB_0022adf0;
      }
      if (bVar3 == 0x3a) {
        uVar8 = (uVar8 >> 4) + 0xba;
        goto LAB_0022adf0;
      }
    }
LAB_0022acd2:
    MCOperand_CreateImm0(mcInst,uVar5);
    if (3 < (byte)(bVar3 - 0x2b)) {
      return false;
    }
LAB_0022adde:
    uVar5 = (ulong)insn->segmentOverride;
    puVar7 = "";
    break;
  case '\x15':
  case '\x16':
  case '\x17':
  case '\x18':
  case '\x1c':
    uVar5 = (ulong)insn->opcodeRegister;
    goto LAB_0022ab51;
  case '\x19':
    uVar8 = (insn->modRM & 7) + 0x72;
    goto LAB_0022adf0;
  case '\x1d':
    goto switchD_0022aab8_caseD_1d;
  case '\x1e':
    bVar3 = insn->isPrefix67;
    if (insn->mode == MODE_32BIT) {
LAB_0022adcd:
      uVar8 = (uint)bVar3 * 0x10 + 0x1d;
    }
    else {
      if (insn->mode != MODE_64BIT) {
        bVar3 = bVar3 ^ 1;
        goto LAB_0022adcd;
      }
      uVar8 = 0x2b;
      if ((_Bool)bVar3 != false) {
        uVar8 = 0x1d;
      }
    }
    MCOperand_CreateReg0(mcInst,uVar8);
    goto LAB_0022adde;
  case '\x1f':
    bVar3 = insn->isPrefix67;
    if (insn->mode == MODE_32BIT) {
      bVar3 = bVar3 ^ 1;
    }
    else if (insn->mode == MODE_64BIT) {
      uVar8 = (uint)(bVar3 ^ 1) * 0x10 + 0x17;
      goto LAB_0022adf0;
    }
    uVar8 = (uint)bVar3 + (uint)bVar3 * 8 + 0xe;
    goto LAB_0022adf0;
  }
  uVar8 = (uint)puVar7[uVar5];
LAB_0022adf0:
  MCOperand_CreateReg0(mcInst,uVar8);
  return false;
switchD_0022aab8_caseD_1d:
  operand = insn->operands + ((ulong)operand->type - 0x4a);
  goto LAB_0022aaa2;
}

Assistant:

static bool translateOperand(MCInst *mcInst, const OperandSpecifier *operand, InternalInstruction *insn)
{
	switch (operand->encoding) {
		case ENCODING_REG:
			translateRegister(mcInst, insn->reg);
			return false;
		case ENCODING_WRITEMASK:
			return translateMaskRegister(mcInst, insn->writemask);
		CASE_ENCODING_RM:
			return translateRM(mcInst, operand, insn);
		case ENCODING_CB:
		case ENCODING_CW:
		case ENCODING_CD:
		case ENCODING_CP:
		case ENCODING_CO:
		case ENCODING_CT:
			//debug("Translation of code offsets isn't supported.");
			return true;
		case ENCODING_IB:
		case ENCODING_IW:
		case ENCODING_ID:
		case ENCODING_IO:
		case ENCODING_Iv:
		case ENCODING_Ia:
			translateImmediate(mcInst, insn->immediates[insn->numImmediatesTranslated++], operand, insn);
			return false;
		case ENCODING_SI:
			return translateSrcIndex(mcInst, insn);
		case ENCODING_DI:
			return translateDstIndex(mcInst, insn);
		case ENCODING_RB:
		case ENCODING_RW:
		case ENCODING_RD:
		case ENCODING_RO:
		case ENCODING_Rv:
			translateRegister(mcInst, insn->opcodeRegister);
			return false;
		case ENCODING_FP:
			translateFPRegister(mcInst, insn->modRM & 7);
			return false;
		case ENCODING_VVVV:
			translateRegister(mcInst, insn->vvvv);
			return false;
		case ENCODING_DUP:
			return translateOperand(mcInst, &insn->operands[operand->type - TYPE_DUP0], insn);
		default:
			//debug("Unhandled operand encoding during translation");
			return true;
	}
}